

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O2

int TRUST_TOKEN_CLIENT_finish_redemption
              (TRUST_TOKEN_CLIENT *ctx,uint8_t **out_rr,size_t *out_rr_len,uint8_t **out_sig,
              size_t *out_sig_len,uint8_t *response,size_t response_len)

{
  int iVar1;
  int line;
  uint8_t *sig_buf;
  uint8_t *srr_buf;
  CBS in;
  size_t sig_len;
  size_t srr_len;
  CBS sig;
  CBS srr;
  EVP_MD_CTX md_ctx;
  
  in.len = response_len;
  in.data = response;
  if (ctx->method->has_srr == 0) {
    iVar1 = CBS_stow(&in,out_rr,out_rr_len);
    if (iVar1 == 0) {
      return 0;
    }
    *out_sig = (uint8_t *)0x0;
    *out_sig_len = 0;
    return 1;
  }
  iVar1 = CBS_get_u16_length_prefixed(&in,&srr);
  if (((iVar1 == 0) || (iVar1 = CBS_get_u16_length_prefixed(&in,&sig), iVar1 == 0)) || (in.len != 0)
     ) {
    iVar1 = 0x67;
    line = 399;
  }
  else if (ctx->srr_key == (EVP_PKEY *)0x0) {
    iVar1 = 0x70;
    line = 0x194;
  }
  else {
    EVP_MD_CTX_init((EVP_MD_CTX *)&md_ctx);
    iVar1 = EVP_DigestVerifyInit
                      ((EVP_MD_CTX *)&md_ctx,(EVP_PKEY_CTX **)0x0,(EVP_MD *)0x0,(ENGINE *)0x0,
                       (EVP_PKEY *)ctx->srr_key);
    if (iVar1 == 0) {
      EVP_MD_CTX_cleanup((EVP_MD_CTX *)&md_ctx);
    }
    else {
      iVar1 = EVP_DigestVerify(&md_ctx,sig.data,sig.len,srr.data,srr.len);
      EVP_MD_CTX_cleanup((EVP_MD_CTX *)&md_ctx);
      if (iVar1 != 0) {
        srr_buf = (uint8_t *)0x0;
        sig_buf = (uint8_t *)0x0;
        iVar1 = CBS_stow(&srr,&srr_buf,&srr_len);
        if ((iVar1 != 0) && (iVar1 = CBS_stow(&sig,&sig_buf,&sig_len), iVar1 != 0)) {
          *out_rr = srr_buf;
          *out_rr_len = srr_len;
          *out_sig = sig_buf;
          *out_sig_len = sig_len;
          return 1;
        }
        OPENSSL_free(srr_buf);
        OPENSSL_free(sig_buf);
        return 0;
      }
    }
    iVar1 = 0x68;
    line = 0x1a0;
  }
  ERR_put_error(0x20,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                ,line);
  return 0;
}

Assistant:

int TRUST_TOKEN_CLIENT_finish_redemption(TRUST_TOKEN_CLIENT *ctx,
                                         uint8_t **out_rr, size_t *out_rr_len,
                                         uint8_t **out_sig, size_t *out_sig_len,
                                         const uint8_t *response,
                                         size_t response_len) {
  CBS in, srr, sig;
  CBS_init(&in, response, response_len);
  if (!ctx->method->has_srr) {
    if (!CBS_stow(&in, out_rr, out_rr_len)) {
      return 0;
    }

    *out_sig = NULL;
    *out_sig_len = 0;
    return 1;
  }

  if (!CBS_get_u16_length_prefixed(&in, &srr) ||
      !CBS_get_u16_length_prefixed(&in, &sig) || CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_ERROR);
    return 0;
  }

  if (ctx->srr_key == NULL) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_NO_SRR_KEY_CONFIGURED);
    return 0;
  }

  EVP_MD_CTX md_ctx;
  EVP_MD_CTX_init(&md_ctx);
  int sig_ok = EVP_DigestVerifyInit(&md_ctx, NULL, NULL, NULL, ctx->srr_key) &&
               EVP_DigestVerify(&md_ctx, CBS_data(&sig), CBS_len(&sig),
                                CBS_data(&srr), CBS_len(&srr));
  EVP_MD_CTX_cleanup(&md_ctx);

  if (!sig_ok) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_SRR_SIGNATURE_ERROR);
    return 0;
  }

  uint8_t *srr_buf = NULL, *sig_buf = NULL;
  size_t srr_len, sig_len;
  if (!CBS_stow(&srr, &srr_buf, &srr_len) ||
      !CBS_stow(&sig, &sig_buf, &sig_len)) {
    OPENSSL_free(srr_buf);
    OPENSSL_free(sig_buf);
    return 0;
  }

  *out_rr = srr_buf;
  *out_rr_len = srr_len;
  *out_sig = sig_buf;
  *out_sig_len = sig_len;
  return 1;
}